

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double fcdf(double x,int num,int den)

{
  double dVar1;
  double dVar2;
  double y;
  double k2;
  double k1;
  double oup;
  int den_local;
  int num_local;
  double x_local;
  
  if ((0 < num) && (0 < den)) {
    if (x < 0.0) {
      printf("The range of distribution only takes non-negative and real values");
      exit(1);
    }
    dVar1 = (double)num;
    dVar2 = (double)den;
    if (dVar2 <= dVar1 * x) {
      k1 = ibetac(dVar2 / (dVar1 * x + dVar2),dVar2 / 2.0,dVar1 / 2.0);
    }
    else {
      k1 = ibeta((dVar1 * x) / (dVar1 * x + dVar2),dVar1 / 2.0,dVar2 / 2.0);
    }
    return k1;
  }
  printf("Degrees Of Freedom should be positive real integers");
  exit(1);
}

Assistant:

double fcdf(double x, int num,int den) {
	double oup,k1,k2,y;
	
	if (num <= 0 || den <= 0) {
		printf("Degrees Of Freedom should be positive real integers");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	
	k1 = (double) num;
	k2 = (double) den;
	
	if (k1 * x < k2) {
		y = k1 * x / (k2 + k1 * x);
		oup = ibeta(y,k1/2.,k2/2.);
	} else {
		y = k2 / (k2 + k1 * x);
		oup = ibetac(y,k2/2.,k1/2.);
	}
	
	return oup;
}